

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  int iVar1;
  Fts5Structure *pFVar2;
  uint in_ECX;
  int in_EDX;
  char *in_RSI;
  Fts5Index *in_RDI;
  Fts5Index *in_R8;
  Fts5Structure *in_R9;
  long in_FS_OFFSET;
  u8 *unaff_retaddr;
  Fts5Index *in_stack_00000008;
  Fts5Iter **in_stack_00000010;
  Fts5SegIter *pSeg;
  int bDesc;
  Fts5Structure *pStruct;
  int nIdxChar;
  int nChar;
  int bTokendata;
  int iPrefixIdx;
  int iIdx;
  Fts5Config *pConfig;
  Fts5Buffer buf;
  Fts5Iter *pRet;
  Fts5Index *in_stack_ffffffffffffff58;
  Fts5Iter *pIter;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  u32 nByte;
  Fts5Buffer *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Fts5Colset *in_stack_ffffffffffffff80;
  u8 *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int iVar3;
  int iVar4;
  Fts5Config *pFVar5;
  int iLevel;
  Fts5Iter **in_stack_ffffffffffffffe0;
  Fts5Iter *pColset_00;
  u8 *puVar6;
  
  nByte = (u32)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  puVar6 = *(u8 **)(in_FS_OFFSET + 0x28);
  pFVar5 = in_RDI->pConfig;
  pColset_00 = (Fts5Iter *)0x0;
  memset(&stack0xffffffffffffffe0,0,0x10);
  iVar1 = sqlite3Fts5BufferSize
                    ((int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff70,nByte);
  if (iVar1 == 0) {
    iVar4 = 0;
    iVar3 = 0;
    iVar1 = pFVar5->bTokendata;
    if (0 < in_EDX) {
      memcpy((undefined1 *)((long)in_stack_ffffffffffffffe0 + 1),in_RSI,(long)in_EDX);
    }
    if ((in_ECX & 0x88) != 0) {
      iVar1 = 0;
    }
    if ((in_ECX & 1) != 0) {
      in_stack_ffffffffffffffa0 = fts5IndexCharlen(in_RSI,in_EDX);
      iVar4 = 1;
      while ((iVar4 <= pFVar5->nPrefix &&
             (in_stack_ffffffffffffff9c = pFVar5->aPrefix[iVar4 + -1],
             in_stack_ffffffffffffff9c != in_stack_ffffffffffffffa0))) {
        if (in_stack_ffffffffffffff9c == in_stack_ffffffffffffffa0 + 1) {
          iVar3 = iVar4;
        }
        iVar4 = iVar4 + 1;
      }
    }
    iLevel = (int)in_RSI;
    if ((iVar1 == 0) || (iVar4 != 0)) {
      if (pFVar5->nPrefix < iVar4) {
        pIter = (Fts5Iter *)&stack0xfffffffffffffff0;
        fts5SetupPrefixIter((Fts5Index *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90,(uint)((in_ECX & 2) != 0),
                            in_stack_ffffffffffffff80,in_stack_00000010);
        if (((pColset_00 != (Fts5Iter *)0x0) &&
            (fts5IterSetOutputCb((int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60
                                                ),pIter), in_RDI->rc == 0)) &&
           (pColset_00->aSeg[pColset_00->aFirst[1].iFirst].pLeaf != (Fts5Data *)0x0)) {
          (*pColset_00->xSetOutputs)(pColset_00,pColset_00->aSeg + pColset_00->aFirst[1].iFirst);
        }
      }
      else {
        pFVar2 = fts5StructureRead(in_stack_ffffffffffffff58);
        *(char *)in_stack_ffffffffffffffe0 = (char)iVar4 + '0';
        if (pFVar2 != (Fts5Structure *)0x0) {
          in_stack_ffffffffffffff60 = 0;
          fts5MultiIterNew(in_R8,in_R9,(int)((ulong)pFVar5 >> 0x20),
                           (Fts5Colset *)CONCAT44(iVar4,iVar3),
                           (u8 *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
                           ,iLevel,(int)in_RDI,in_stack_ffffffffffffffe0);
          fts5StructureRelease
                    ((Fts5Structure *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
          ;
        }
      }
    }
    else {
      *(undefined1 *)in_stack_ffffffffffffffe0 = 0x30;
      pColset_00 = fts5SetupTokendataIter
                             (in_stack_00000008,unaff_retaddr,(int)((ulong)puVar6 >> 0x20),
                              (Fts5Colset *)pColset_00);
    }
    if (in_RDI->rc != 0) {
      fts5IterClose((Fts5IndexIter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pColset_00 = (Fts5Iter *)0x0;
      fts5IndexCloseReader
                ((Fts5Index *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    *(Fts5Iter **)in_R9 = pColset_00;
    sqlite3Fts5BufferFree((Fts5Buffer *)0x276311);
  }
  iVar1 = fts5IndexReturn(in_RDI);
  if (*(u8 **)(in_FS_OFFSET + 0x28) != puVar6) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    int iPrefixIdx = 0;           /* +1 prefix index */
    int bTokendata = pConfig->bTokendata;
    assert( buf.p!=0 );
    if( nToken>0 ) memcpy(&buf.p[1], pToken, nToken);

    /* The NOTOKENDATA flag is set when each token in a tokendata=1 table
    ** should be treated individually, instead of merging all those with
    ** a common prefix into a single entry. This is used, for example, by
    ** queries performed as part of an integrity-check, or by the fts5vocab
    ** module.  */
    if( flags & (FTS5INDEX_QUERY_NOTOKENDATA|FTS5INDEX_QUERY_SCAN) ){
      bTokendata = 0;
    }

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists),
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        int nIdxChar = pConfig->aPrefix[iIdx-1];
        if( nIdxChar==nChar ) break;
        if( nIdxChar==nChar+1 ) iPrefixIdx = iIdx;
      }
    }

    if( bTokendata && iIdx==0 ){
      buf.p[0] = FTS5_MAIN_PREFIX;
      pRet = fts5SetupTokendataIter(p, buf.p, nToken+1, pColset);
    }else if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY,
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index for a prefix query. */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      fts5SetupPrefixIter(p, bDesc, iPrefixIdx, buf.p, nToken+1, pColset,&pRet);
      if( pRet==0 ){
        assert( p->rc!=SQLITE_OK );
      }else{
        assert( pRet->pColset==0 );
        fts5IterSetOutputCb(&p->rc, pRet);
        if( p->rc==SQLITE_OK ){
          Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
          if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
        }
      }
    }

    if( p->rc ){
      fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5IndexCloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}